

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::TestHttpService::TestHttpService
          (TestHttpService *this,HttpRequestTestCase *expectedRequest,HttpResponseTestCase *response
          ,HttpHeaderTable *table)

{
  HttpHeaderTable *table_local;
  HttpResponseTestCase *response_local;
  HttpRequestTestCase *expectedRequest_local;
  TestHttpService *this_local;
  
  HttpService::HttpService(&this->super_HttpService);
  (this->super_HttpService)._vptr_HttpService = (_func_int **)&PTR_request_007cdc08;
  this->singleExpectedRequest = expectedRequest;
  this->singleResponse = response;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase>::ArrayPtr(&this->testCases);
  HttpHeaders::HttpHeaders(&this->responseHeaders,table);
  this->requestCount = 0;
  return;
}

Assistant:

TestHttpService(const HttpRequestTestCase& expectedRequest,
                  const HttpResponseTestCase& response,
                  HttpHeaderTable& table)
      : singleExpectedRequest(&expectedRequest),
        singleResponse(&response),
        responseHeaders(table) {}